

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O3

void __thiscall HinOut::writeDataColumnWise(HinOut *this)

{
  long *plVar1;
  ostream *poVar2;
  char cVar3;
  long lVar4;
  ofstream f;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228);
  std::ofstream::open((string *)&local_228,(int)this + 2000);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&local_228,this->onumCol);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&local_228,this->onumRow);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&local_228,this->oAcountX);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  if (-1 < this->onumCol) {
    lVar4 = -1;
    do {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&local_228,
                          (this->oAstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4 + 1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->onumCol);
  }
  std::ios::widen((char)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  cVar3 = (char)&local_228;
  std::ostream::put(cVar3);
  std::ostream::flush();
  if (0 < this->oAcountX) {
    lVar4 = 0;
    do {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&local_228,
                          (this->oAindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->oAcountX);
  }
  std::ios::widen((char)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put(cVar3);
  std::ostream::flush();
  *(undefined8 *)(local_220 + *(long *)(local_228 + -0x18)) = 9;
  if (0 < this->oAcountX) {
    lVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>
                         ((this->oAvalue).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->oAcountX);
  }
  std::ios::widen((char)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put(cVar3);
  std::ostream::flush();
  *(undefined8 *)(local_220 + *(long *)(local_228 + -0x18)) = 9;
  if (0 < this->onumCol) {
    lVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>
                         ((this->ocolCost).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->onumCol);
  }
  std::ios::widen((char)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put(cVar3);
  std::ostream::flush();
  if (0 < this->onumCol) {
    lVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>
                         ((this->ocolLower).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->onumCol);
  }
  std::ios::widen((char)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put(cVar3);
  std::ostream::flush();
  if (0 < this->onumCol) {
    lVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>
                         ((this->ocolUpper).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->onumCol);
  }
  std::ios::widen((char)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put(cVar3);
  std::ostream::flush();
  *(undefined8 *)(local_220 + *(long *)(local_228 + -0x18)) = 9;
  if (0 < this->onumRow) {
    lVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>
                         ((this->orowLower).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->onumRow);
  }
  std::ios::widen((char)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put(cVar3);
  std::ostream::flush();
  if (0 < this->onumRow) {
    lVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>
                         ((this->orowUpper).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->onumRow);
  }
  std::ios::widen((char)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::ofstream::close();
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void HinOut::writeDataColumnWise() {
	ofstream f;
	int i;

	f.open (fileOut, ios::out );

	//counts
	f << onumCol << endl;
	f << onumRow << endl;
	f << oAcountX << endl;



	//matrix
	for (i=0; i<onumCol+1; i++)
		f << oAstart[i]<<" ";
	f<<endl;

	for (i=0; i<oAcountX; i++)
		f << oAindex[i]<<" ";
	f<<endl;

	f<<setprecision(9);
	for (i=0; i<oAcountX; i++)
		f  << oAvalue[i]<<" ";

	f<<endl;


	//cost and bounds
	f<<setprecision(9);
	for (i=0; i<onumCol; i++)
			f << ocolCost[i]<<" ";

	f<<endl;


	for (i=0; i<onumCol; i++)
			f << ocolLower[i]<<" ";
	f<<endl;


	for (i=0; i<onumCol; i++)
			f <<  ocolUpper[i]<<" ";
	f<<endl;

	f<<setprecision(9);
	for (i=0; i<onumRow; i++)
			f << orowLower[i]<<" ";
	f<<endl;


	for (i=0; i<onumRow; i++)
			f << orowUpper[i]<<" ";
	f<<endl;

	f.close();

}